

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O1

bool __thiscall
cmExportCommand::InitialPass
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  string *psVar7;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar8;
  cmExportBuildFileGenerator *pcVar9;
  iterator iVar10;
  cmExportSet *pcVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  _Rb_tree_header *p_Var14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  string *ct;
  cmCommandArgument *this_01;
  undefined1 config [8];
  pointer pbVar17;
  string setName;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  undefined1 local_1e8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [6];
  ios_base local_178 [272];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17) < 0x21) {
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"called with too few arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
    if (local_1e8 != (undefined1  [8])local_1d8) {
      operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  iVar5 = std::__cxx11::string::compare((char *)pbVar17);
  if (iVar5 == 0) {
    bVar3 = HandlePackage(this,args);
    return bVar3;
  }
  iVar5 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  this_01 = &(this->ExportSetName).super_cmCommandArgument;
  if (iVar5 != 0) {
    this_01 = &(this->Targets).super_cmCommandArgument;
  }
  cmCommandArgument::Follows(this_01,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&this->ArgumentGroup,this_01);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&this->Helper,args,&local_68);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Unknown arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
    if (local_1e8 != (undefined1  [8])local_1d8) {
      operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity + 1);
    }
    bVar3 = false;
    goto LAB_0022f008;
  }
  local_248._M_allocated_capacity = (size_type)&local_238;
  local_248._8_8_ = 0;
  local_238._M_local_buf[0] = '\0';
  bVar3 = (this->AndroidMKFile).super_cmCommandArgument.WasActive;
  if (bVar3 == true) {
    std::__cxx11::string::_M_assign((string *)local_248._M_local_buf);
  }
  if (((this->Filename).super_cmCommandArgument.WasActive == false) && (local_248._8_8_ == 0)) {
    iVar5 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     &(this->ExportSetName).String,".cmake");
      std::__cxx11::string::operator=((string *)local_248._M_local_buf,(string *)local_1e8);
      if (local_1e8 != (undefined1  [8])local_1d8) {
        operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity + 1);
      }
      goto LAB_0022ea86;
    }
    local_1e8 = (undefined1  [8])local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"FILE <filename> option missing.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
    if (local_1e8 != (undefined1  [8])local_1d8) {
      operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity + 1);
    }
LAB_0022eb56:
    bVar3 = false;
  }
  else {
    if (local_248._8_8_ == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,(this->Filename).String._M_dataplus._M_p,
                 (allocator<char> *)&local_228);
      cmsys::SystemTools::GetFilenameLastExtension((string *)local_1e8,&local_268);
      iVar5 = std::__cxx11::string::compare(local_1e8);
      if (local_1e8 != (undefined1  [8])local_1d8) {
        operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if (iVar5 == 0) {
        std::__cxx11::string::_M_assign((string *)local_248._M_local_buf);
        goto LAB_0022ea86;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"FILE option given filename \"",0x1c);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1e8,(this->Filename).String._M_dataplus._M_p,
                          (this->Filename).String._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\" which does not have an extension of \".cmake\".\n",0x30);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
LAB_0022eb28:
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
LAB_0022eb35:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base(local_178);
      goto LAB_0022eb56;
    }
LAB_0022ea86:
    bVar4 = cmsys::SystemTools::FileIsFullPath((string *)&local_248);
    if (bVar4) {
      bVar4 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,(string *)&local_248);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,"FILE option given filename \"",0x1c);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1e8,(char *)local_248._M_allocated_capacity,
                            local_248._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\" which is in the source tree.\n",0x1f);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) goto LAB_0022eb28;
        goto LAB_0022eb35;
      }
    }
    else {
      psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      local_1e8 = (undefined1  [8])local_1d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e8,pcVar2,pcVar2 + psVar7->_M_string_length);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,local_1e8,(char *)((long)local_1e8 + (long)paStack_1e0));
      std::__cxx11::string::append((char *)&local_228);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_228,local_248._M_allocated_capacity);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar13) {
        local_268.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_268.field_2._8_8_ = plVar12[3];
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      }
      else {
        local_268.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_268._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_268._M_string_length = plVar12[1];
      *plVar12 = (long)paVar13;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_248._M_local_buf,(string *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (local_1e8 != (undefined1  [8])local_1d8) {
        operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity + 1);
      }
    }
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    iVar5 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar5 == 0) {
      if ((this->Append).Enabled == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,"EXPORT signature does not recognise the APPEND option.",
                   0x36);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_268);
      }
      else {
        if ((this->ExportOld).Enabled != true) {
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          pcVar2 = (this->ExportSetName).String._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_268,pcVar2,
                     pcVar2 + (this->ExportSetName).String._M_string_length);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                           *)&this_00->ExportSets,&local_268);
          p_Var14 = &(this_00->ExportSets).
                     super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet_*>_>_>
                     ._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar10._M_node == p_Var14) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"Export set \"",0xc);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e8,local_268._M_dataplus._M_p,
                                local_268._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" not found.",0xc);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base(local_178);
          }
          else {
            pcVar11 = cmExportSetMap::operator[](&this_00->ExportSets,&local_268);
            this->ExportSet = pcVar11;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)iVar10._M_node != p_Var14) goto LAB_0022f150;
          goto LAB_0022efe0;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,
                   "EXPORT signature does not recognise the EXPORT_LINK_INTERFACE_LIBRARIES option."
                   ,0x4f);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_268);
      }
LAB_0022efa4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base(local_178);
LAB_0022efe0:
      bVar3 = false;
    }
    else {
      if ((this->Targets).super_cmCommandArgument.WasActive != true) {
        local_1e8 = (undefined1  [8])local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"EXPORT or TARGETS specifier missing.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
        uVar15 = local_1d8[0]._M_allocated_capacity;
        _Var16._M_p = (pointer)local_1e8;
        if (local_1e8 != (undefined1  [8])local_1d8) {
LAB_0022ee13:
          operator_delete(_Var16._M_p,uVar15 + 1);
        }
        goto LAB_0022efe0;
      }
      pbVar17 = (this->Targets).Vector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (this->Targets).Vector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar17 != pbVar1) {
        do {
          bVar4 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,pbVar17);
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"given ALIAS target \"",0x14);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e8,(pbVar17->_M_dataplus)._M_p,
                                pbVar17->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\" which may not be exported.",0x1c);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_268);
            goto LAB_0022efa4;
          }
          pcVar8 = cmGlobalGenerator::FindTarget(this_00,pbVar17,false);
          if (pcVar8 == (cmTarget *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"given target \"",0xe);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e8,(pbVar17->_M_dataplus)._M_p,
                                pbVar17->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\" which is not built by this project.",0x25);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_268);
            goto LAB_0022efa4;
          }
          if (pcVar8->TargetTypeValue == UTILITY) {
            std::operator+(&local_268,"given custom target \"",pbVar17);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_268);
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 == paVar13) {
              local_1d8[0]._0_8_ = paVar13->_M_allocated_capacity;
              local_1d8[0]._8_8_ = plVar12[3];
              local_1e8 = (undefined1  [8])local_1d8;
            }
            else {
              local_1d8[0]._0_8_ = paVar13->_M_allocated_capacity;
              local_1e8 = (undefined1  [8])*plVar12;
            }
            paStack_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)plVar12[1];
            *plVar12 = (long)paVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
            if (local_1e8 != (undefined1  [8])local_1d8) {
              operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity + 1);
            }
            uVar15 = local_268.field_2._M_allocated_capacity;
            _Var16._M_p = local_268._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p == &local_268.field_2) goto LAB_0022efe0;
            goto LAB_0022ee13;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_208,pbVar17);
          pbVar17 = pbVar17 + 1;
        } while (pbVar17 != pbVar1);
      }
      if (((this->Append).Enabled == true) &&
         (pcVar9 = cmGlobalGenerator::GetExportedTargetsFile(this_00,(string *)&local_248),
         pcVar9 != (cmExportBuildFileGenerator *)0x0)) {
        bVar3 = true;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pcVar9->Targets,
                   (pcVar9->Targets).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_208.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_208.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
LAB_0022f150:
        if (bVar3 == false) {
          pcVar9 = (cmExportBuildFileGenerator *)operator_new(0x140);
          cmExportBuildFileGenerator::cmExportBuildFileGenerator(pcVar9);
        }
        else {
          pcVar9 = (cmExportBuildFileGenerator *)operator_new(0x140);
          cmExportBuildAndroidMKGenerator::cmExportBuildAndroidMKGenerator
                    ((cmExportBuildAndroidMKGenerator *)pcVar9);
        }
        cmExportFileGenerator::SetExportFile
                  (&pcVar9->super_cmExportFileGenerator,(char *)local_248._M_allocated_capacity);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e8,(this->Namespace).String._M_dataplus._M_p,
                   (allocator<char> *)&local_268);
        std::__cxx11::string::_M_assign((string *)&(pcVar9->super_cmExportFileGenerator).Namespace);
        if (local_1e8 != (undefined1  [8])local_1d8) {
          operator_delete((void *)local_1e8,local_1d8[0]._M_allocated_capacity + 1);
        }
        (pcVar9->super_cmExportFileGenerator).AppendMode = (this->Append).Enabled;
        if (this->ExportSet == (cmExportSet *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pcVar9->Targets,&local_208);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet(pcVar9,this->ExportSet);
        }
        cmMakefile::AddExportBuildFileGenerator((this->super_cmCommand).Makefile,pcVar9);
        (pcVar9->super_cmExportFileGenerator).ExportOld = (this->ExportOld).Enabled;
        local_1e8 = (undefined1  [8])0x0;
        paStack_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_1d8[0]._M_allocated_capacity = 0;
        cmMakefile::GetConfigurations
                  (&local_50,(this->super_cmCommand).Makefile,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1e8,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        config = local_1e8;
        paVar13 = paStack_1e0;
        if (local_1e8 == (undefined1  [8])paStack_1e0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1e8);
          config = local_1e8;
          paVar13 = paStack_1e0;
        }
        for (; config != (undefined1  [8])paVar13; config = (undefined1  [8])((long)config + 0x20))
        {
          cmExportFileGenerator::AddConfiguration
                    (&pcVar9->super_cmExportFileGenerator,(string *)config);
        }
        if (this->ExportSet == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(this_00,pcVar9);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(this_00,pcVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e8);
        bVar3 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_allocated_capacity != &local_238) {
    operator_delete((void *)local_248._M_allocated_capacity,
                    CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1);
  }
LAB_0022f008:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return bVar3;
}

Assistant:

bool cmExportCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return this->HandlePackage(args);
  }
  if (args[0] == "EXPORT") {
    this->ExportSetName.Follows(nullptr);
    this->ArgumentGroup.Follows(&this->ExportSetName);
  } else {
    this->Targets.Follows(nullptr);
    this->ArgumentGroup.Follows(&this->Targets);
  }

  std::vector<std::string> unknownArgs;
  this->Helper.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    this->SetError("Unknown arguments.");
    return false;
  }

  std::string fname;
  bool android = false;
  if (this->AndroidMKFile.WasFound()) {
    fname = this->AndroidMKFile.GetString();
    android = true;
  }
  if (!this->Filename.WasFound() && fname.empty()) {
    if (args[0] != "EXPORT") {
      this->SetError("FILE <filename> option missing.");
      return false;
    }
    fname = this->ExportSetName.GetString() + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(this->Filename.GetCString()) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << this->Filename.GetString()
        << "\" which does not have an extension of \".cmake\".\n";
      this->SetError(e.str());
      return false;
    }
    fname = this->Filename.GetString();
  }

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!this->Makefile->CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      this->SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string dir = this->Makefile->GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();

  if (args[0] == "EXPORT") {
    if (this->Append.IsEnabled()) {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the APPEND option.";
      this->SetError(e.str());
      return false;
    }

    if (this->ExportOld.IsEnabled()) {
      std::ostringstream e;
      e << "EXPORT signature does not recognise the "
           "EXPORT_LINK_INTERFACE_LIBRARIES option.";
      this->SetError(e.str());
      return false;
    }

    cmExportSetMap& setMap = gg->GetExportSets();
    std::string setName = this->ExportSetName.GetString();
    if (setMap.find(setName) == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << setName << "\" not found.";
      this->SetError(e.str());
      return false;
    }
    this->ExportSet = setMap[setName];
  } else if (this->Targets.WasFound()) {
    for (std::string const& currentTarget : this->Targets.GetVector()) {
      if (this->Makefile->IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        this->SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          this->SetError("given custom target \"" + currentTarget +
                         "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        this->SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (this->Append.IsEnabled()) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    this->SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // Setup export file generation.
  cmExportBuildFileGenerator* ebfg = nullptr;
  if (android) {
    ebfg = new cmExportBuildAndroidMKGenerator;
  } else {
    ebfg = new cmExportBuildFileGenerator;
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(this->Namespace.GetCString());
  ebfg->SetAppendMode(this->Append.IsEnabled());
  if (this->ExportSet) {
    ebfg->SetExportSet(this->ExportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  this->Makefile->AddExportBuildFileGenerator(ebfg);
  ebfg->SetExportOld(this->ExportOld.IsEnabled());

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes;
  this->Makefile->GetConfigurations(configurationTypes);
  if (configurationTypes.empty()) {
    configurationTypes.emplace_back();
  }
  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (this->ExportSet) {
    gg->AddBuildExportExportSet(ebfg);
  } else {
    gg->AddBuildExportSet(ebfg);
  }

  return true;
}